

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_all.h
# Opt level: O0

void __thiscall
wasm::FindAllPointers<wasm::LocalSet>::FindAllPointers
          (FindAllPointers<wasm::LocalSet> *this,Expression **ast)

{
  undefined1 local_100 [8];
  PointerFinder finder;
  Expression **ast_local;
  FindAllPointers<wasm::LocalSet> *this_local;
  
  finder.list = (vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)ast;
  std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::vector(&this->list);
  PointerFinder::PointerFinder((PointerFinder *)local_100);
  finder.
  super_PostWalker<wasm::PointerFinder,_wasm::UnifiedExpressionVisitor<wasm::PointerFinder,_void>_>.
  super_Walker<wasm::PointerFinder,_wasm::UnifiedExpressionVisitor<wasm::PointerFinder,_void>_>.
  currModule._0_4_ = 9;
  finder._216_8_ = this;
  Walker<wasm::PointerFinder,_wasm::UnifiedExpressionVisitor<wasm::PointerFinder,_void>_>::walk
            ((Walker<wasm::PointerFinder,_wasm::UnifiedExpressionVisitor<wasm::PointerFinder,_void>_>
              *)local_100,(Expression **)finder.list);
  PointerFinder::~PointerFinder((PointerFinder *)local_100);
  return;
}

Assistant:

FindAllPointers(Expression*& ast) {
    PointerFinder finder;
    finder.id = (Expression::Id)T::SpecificId;
    finder.list = &list;
    finder.walk(ast);
  }